

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  Node *pNVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint newasize;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  Counters local_bc;
  
  if ((value->tt_ & 0xf) != 0) {
    iVar2 = insertkey(t,key,value);
    if (iVar2 == 0) {
      iVar2 = 0;
      memset(&local_bc.na,0,0x88);
      local_bc.total = 1;
      if (key->tt_ == '\x03') {
        countint((key->value_).i,&local_bc);
      }
      lVar11 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) * 0x18 + 0x10;
      do {
        pNVar1 = t->node;
        if ((*(byte *)((long)pNVar1 + lVar11 + -8) & 0xf) == 0) {
          local_bc.deleted = 1;
        }
        else {
          iVar2 = iVar2 + 1;
          if (*(char *)((long)pNVar1 + lVar11 + -7) == '\x03') {
            countint(*(lua_Integer *)((long)pNVar1 + lVar11),&local_bc);
          }
        }
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != -8);
      iVar2 = iVar2 + local_bc.total;
      newasize = t->asize;
      if (local_bc.na == 0) {
        iVar10 = 0;
      }
      else {
        lVar11 = 0;
        uVar6 = 1;
        iVar4 = 0;
        uVar5 = 1;
        do {
          uVar9 = uVar5;
          if ((newasize < uVar5) && (uVar9 = newasize, newasize < uVar6)) break;
          iVar10 = 0;
          if (uVar6 <= uVar9) {
            uVar6 = uVar6 - 1;
            iVar10 = 0;
            do {
              iVar10 = (iVar10 + 1) -
                       (uint)((*(byte *)((long)t->array + (ulong)uVar6 + 4) & 0xf) == 0);
              uVar6 = uVar6 + 1;
            } while (uVar9 != uVar6);
            uVar6 = uVar9 + 1;
          }
          local_bc.nums[lVar11] = local_bc.nums[lVar11] + iVar10;
          iVar4 = iVar4 + iVar10;
          lVar11 = lVar11 + 1;
          uVar5 = uVar5 * 2;
        } while (lVar11 != 0x20);
        iVar2 = iVar2 + iVar4;
        uVar5 = 1;
        lVar11 = 0;
        newasize = 0;
        uVar3 = 0;
        uVar7 = 0;
        do {
          iVar10 = (int)uVar3;
          uVar8 = (ulong)uVar5;
          if ((ulong)(local_bc.na + iVar4) * 3 < uVar8) break;
          uVar6 = local_bc.nums[lVar11];
          uVar7 = (ulong)((int)uVar7 + uVar6);
          bVar12 = uVar8 <= uVar7 * 3;
          if (bVar12 && uVar6 != 0) {
            uVar3 = uVar7;
          }
          iVar10 = (int)uVar3;
          if (bVar12 && uVar6 != 0) {
            newasize = uVar5;
          }
          lVar11 = lVar11 + 1;
          uVar5 = uVar5 * 2;
        } while (lVar11 != 0x20);
      }
      uVar5 = (uint)(iVar2 - iVar10) >> 2;
      if (local_bc.deleted == 0) {
        uVar5 = 0;
      }
      luaH_resize(L,t,newasize,uVar5 + (iVar2 - iVar10));
      newcheckedkey(t,key,value);
    }
    if ((((key->tt_ & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
       ((((key->value_).gc)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(GCObject *)t);
      return;
    }
  }
  return;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  if (!ttisnil(value)) {  /* do not insert nil values */
    int done = insertkey(t, key, value);
    if (!done) {  /* could not find a free place? */
      rehash(L, t, key);  /* grow table */
      newcheckedkey(t, key, value);  /* insert key in grown table */
    }
    luaC_barrierback(L, obj2gco(t), key);
    /* for debugging only: any new key may force an emergency collection */
    condchangemem(L, (void)0, (void)0, 1);
  }
}